

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Maybe<kj::HttpHeaders::Request> * __thiscall
kj::HttpHeaders::tryParseRequest
          (Maybe<kj::HttpHeaders::Request> *__return_storage_ptr__,HttpHeaders *this,
          ArrayPtr<char> content)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  char *end;
  char *ptr;
  char *local_58;
  HttpMethod local_4c;
  kj local_48 [4];
  HttpMethod local_44;
  char *local_40;
  size_t local_38;
  
  uVar3 = content.size_;
  local_58 = content.ptr;
  if ((uVar3 < 2) || (local_58[uVar3 - 1] != '\n')) {
    end = (char *)0x0;
  }
  else {
    lVar1 = uVar3 - 1;
    if (local_58[uVar3 - 2] == '\r') {
      lVar1 = uVar3 - 2;
    }
    end = local_58 + lVar1;
    local_58[~(ulong)(local_58[uVar3 - 2] == '\r') + uVar3] = '\0';
  }
  if (((end != (char *)0x0) && (consumeHttpMethod(local_48,&local_58), local_48[0] == (kj)0x1)) &&
     ((*local_58 == ' ' || (*local_58 == '\t')))) {
    local_4c = local_44;
    local_58 = local_58 + 1;
    consumeWord(&local_58);
    if (local_48[0] != (kj)0x1) {
      (__return_storage_ptr__->ptr).isSet = false;
      local_40 = "";
      local_38 = 1;
    }
    if (local_48[0] == (kj)0x0) {
      return __return_storage_ptr__;
    }
    consumeLine(&local_58);
    bVar2 = parseHeaders(this,local_58,end);
    if (bVar2) {
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.method = local_4c;
      (__return_storage_ptr__->ptr).field_1.value.url.content.ptr = local_40;
      (__return_storage_ptr__->ptr).field_1.value.url.content.size_ = local_38;
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->ptr).isSet = false;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<HttpHeaders::Request> HttpHeaders::tryParseRequest(kj::ArrayPtr<char> content) {
  char* end = trimHeaderEnding(content);
  if (end == nullptr) return nullptr;

  char* ptr = content.begin();

  HttpHeaders::Request request;

  KJ_IF_MAYBE(method, consumeHttpMethod(ptr)) {
    request.method = *method;
    if (*ptr != ' ' && *ptr != '\t') {
      return nullptr;
    }
    ++ptr;
  } else {
    return nullptr;
  }

  KJ_IF_MAYBE(path, consumeWord(ptr)) {
    request.url = *path;
  } else {
    return nullptr;
  }

  // Ignore rest of line. Don't care about "HTTP/1.1" or whatever.
  consumeLine(ptr);

  if (!parseHeaders(ptr, end)) return nullptr;

  return request;
}